

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O0

void ggml_compute_forward_arange(ggml_compute_params *params,ggml_tensor *dst)

{
  int *in_RSI;
  ggml_tensor *in_stack_00000018;
  ggml_compute_params *in_stack_00000020;
  
  if (*in_RSI == 0) {
    ggml_compute_forward_arange_f32(in_stack_00000020,in_stack_00000018);
  }
  else {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x1a55,"fatal error");
  }
  return;
}

Assistant:

void ggml_compute_forward_arange(
    const ggml_compute_params * params,
    ggml_tensor * dst) {
    switch (dst->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_arange_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}